

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

xmlChar * xmlStrcasestr(xmlChar *str,xmlChar *val)

{
  byte *pbVar1;
  int iVar2;
  size_t sVar3;
  xmlChar *pxVar4;
  byte bVar5;
  long lVar6;
  
  if (val == (xmlChar *)0x0 || str == (xmlChar *)0x0) {
    str = (xmlChar *)0x0;
  }
  else {
    sVar3 = strlen((char *)val);
    iVar2 = (int)sVar3;
    if (iVar2 != 0 && sVar3 < 0x80000000) {
      bVar5 = *str;
      if (bVar5 == 0) {
        str = (xmlChar *)0x0;
      }
      else {
        pxVar4 = str;
        do {
          if (""[bVar5] == ""[*val]) {
            if (iVar2 < 1) {
              return pxVar4;
            }
            if (pxVar4 == val) {
              return pxVar4;
            }
            lVar6 = 0;
            while (pbVar1 = val + lVar6, ""[pxVar4[lVar6]] == ""[*pbVar1]) {
              if (iVar2 + -1 == (int)lVar6) {
                return pxVar4;
              }
              lVar6 = lVar6 + 1;
              if (*pbVar1 == 0) {
                return pxVar4;
              }
            }
          }
          bVar5 = pxVar4[1];
          pxVar4 = pxVar4 + 1;
          str = (xmlChar *)0x0;
        } while (bVar5 != 0);
      }
    }
  }
  return str;
}

Assistant:

const xmlChar *
xmlStrcasestr(const xmlChar *str, const xmlChar *val) {
    int n;

    if (str == NULL) return(NULL);
    if (val == NULL) return(NULL);
    n = xmlStrlen(val);

    if (n == 0) return(str);
    while (*str != 0) { /* non input consuming */
        if (casemap[*str] == casemap[*val])
            if (!xmlStrncasecmp(str, val, n)) return(str);
        str++;
    }
    return(NULL);
}